

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitIsop.c
# Opt level: O3

void Kit_TruthIsopPrintCover(Vec_Int_t *vCover,int nVars,int fCompl)

{
  int iVar1;
  int iVar2;
  int __c;
  byte bVar3;
  long lVar4;
  
  iVar1 = vCover->nSize;
  if (iVar1 != 0) {
    if (iVar1 == 1) {
      if (*vCover->pArray == 0) goto LAB_005e1671;
    }
    else if (iVar1 < 1) {
      return;
    }
    lVar4 = 0;
    do {
      if (0 < nVars) {
        iVar1 = vCover->pArray[lVar4];
        bVar3 = 0;
        iVar2 = nVars;
        do {
          switch(iVar1 >> (bVar3 & 0x1f) & 3) {
          case 0:
            __c = 0x2d;
            break;
          case 1:
            __c = 0x30;
            break;
          case 2:
            __c = 0x31;
            break;
          case 3:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                          ,0xca,"void Kit_TruthIsopPrintCover(Vec_Int_t *, int, int)");
          }
          putchar(__c);
          bVar3 = bVar3 + 2;
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
      }
      printf(" %d\n",(ulong)(fCompl == 0));
      lVar4 = lVar4 + 1;
    } while (lVar4 < vCover->nSize);
    return;
  }
LAB_005e1671:
  printf("Constant %d\n");
  return;
}

Assistant:

void Kit_TruthIsopPrintCover( Vec_Int_t * vCover, int nVars, int fCompl )
{
    int i, k, Entry, Literal;
    if ( Vec_IntSize(vCover) == 0 || (Vec_IntSize(vCover) == 1 && Vec_IntEntry(vCover, 0) == 0) )
    {
        printf( "Constant %d\n", Vec_IntSize(vCover) );
        return;
    }
    Vec_IntForEachEntry( vCover, Entry, i )
    { 
        for ( k = 0; k < nVars; k++ )
        {
            Literal = 3 & (Entry >> (k << 1));
            if ( Literal == 1 ) // neg literal
                printf( "0" );
            else if ( Literal == 2 ) // pos literal
                printf( "1" );
            else if ( Literal == 0 ) 
                printf( "-" );
            else assert( 0 );
        }
        printf( " %d\n", !fCompl );
    }
}